

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

void * __thiscall glcts::anon_unknown_0::UniformValue::getPtr(UniformValue *this,int arrayElement)

{
  GLenum GVar1;
  pair<int,_int> pVar2;
  int iVar3;
  
  pVar2 = (this->type).size;
  iVar3 = pVar2.second * pVar2.first;
  GVar1 = (this->type).baseType;
  if ((int)GVar1 < 0x1406) {
    if (GVar1 == 0x1404) {
LAB_00bbc73d:
      return (this->iValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar3 * arrayElement;
    }
    if (GVar1 == 0x1405) {
      return (this->uValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar3 * arrayElement;
    }
  }
  else {
    if (GVar1 == 0x1406) {
      return (this->fValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + iVar3 * arrayElement;
    }
    if (GVar1 == 0x82e6) goto LAB_00bbc73d;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x253,"const void *glcts::(anonymous namespace)::UniformValue::getPtr(int) const");
}

Assistant:

const void* getPtr(int arrayElement) const
	{
		int arrayElementSize = type.getSize().first * type.getSize().second;
		if (type.getBaseType() == GL_INT || type.getBaseType() == GL_SAMPLER)
		{
			return &iValues[arrayElement * arrayElementSize];
		}
		else if (type.getBaseType() == GL_UNSIGNED_INT)
		{
			return &uValues[arrayElement * arrayElementSize];
		}
		else if (type.getBaseType() == GL_FLOAT)
		{
			return &fValues[arrayElement * arrayElementSize];
		}
		assert(0);
		return NULL;
	}